

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::
     PrintValue<std::unordered_set<jessilib::object,std::hash<jessilib::object>,std::equal_to<jessilib::object>,std::allocator<jessilib::object>>,void>
               (unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
                *container,ostream *os)

{
  bool bVar1;
  long lVar2;
  __node_base *p_Var3;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  p_Var3 = &(container->_M_h)._M_before_begin;
  lVar2 = 0;
  do {
    p_Var3 = p_Var3->_M_nxt;
    if (p_Var3 == (__node_base *)0x0) break;
    if (lVar2 == 0) {
LAB_001e18dd:
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
      testing::internal::PrintBytesInObjectTo((uchar *)(p_Var3 + 2),0x40,os);
      lVar2 = lVar2 + 1;
      bVar1 = true;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1);
      if (lVar2 != 0x20) goto LAB_001e18dd;
      std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
      lVar2 = 0x20;
      bVar1 = false;
    }
  } while (bVar1);
  if (lVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }